

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O3

void play_game(game_mode_type mode)

{
  uint32_t *puVar1;
  bool bVar2;
  uint uVar3;
  player *p;
  term *t;
  savefile_getter psVar4;
  _Bool _Var5;
  _Bool _Var6;
  char **entries;
  char **entries_00;
  char *pcVar7;
  menu_iter *iter;
  menu *menu;
  ulong uVar8;
  wchar_t wVar9;
  ulong uVar10;
  wchar_t wVar11;
  char *pcVar12;
  ulong uVar13;
  size_t len;
  ulong uVar14;
  long lVar15;
  byte bVar16;
  ui_event uVar17;
  savefile_getter g;
  int local_70;
  savefile_getter local_68;
  game_mode_type local_5c;
  region local_58;
  char *local_40;
  ulong local_38;
  
  local_5c = mode;
  do {
    play_again = false;
    if (local_5c < GAME_SELECT) {
      _Var5 = start_game(local_5c == GAME_NEW);
      pcVar12 = "Broken savefile";
      if (!_Var5) {
LAB_001cf2d8:
        quit(pcVar12);
      }
    }
    else {
      pcVar12 = "Invalid game mode in play_game()";
      if (local_5c != GAME_SELECT) goto LAB_001cf2d8;
      _Var5 = false;
      pcVar12 = "";
      do {
        local_68 = (savefile_getter)0x0;
        entries = (char **)mem_zalloc(0x80);
        entries_00 = (char **)mem_zalloc(0x80);
        local_58.col = 0;
        local_58.row = 3;
        local_58.width = 0;
        local_58.page_rows = 0;
        _Var6 = got_savefile(&local_68);
        if (_Var6) {
          uVar14 = 0;
          uVar13 = 0x10;
          uVar10 = 1;
          local_70 = 0;
          local_40 = pcVar12;
          do {
            psVar4 = local_68;
            if ((local_68 == (savefile_getter)0x0) || (local_68->have_details == false)) {
              __assert_fail("details",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                            ,0x304,"void select_savefile(_Bool, _Bool *)");
            }
            if (uVar10 == uVar13) {
              uVar3 = (int)uVar13 * 2;
              len = (long)(int)uVar3 << 3;
              local_38 = uVar10;
              entries = (char **)mem_realloc(entries,len);
              uVar10 = local_38;
              uVar13 = (ulong)uVar3;
              entries_00 = (char **)mem_realloc(entries_00,len);
            }
            pcVar12 = (psVar4->details).fnam + (psVar4->details).foff;
            if ((psVar4->details).desc == (char *)0x0) {
              pcVar12 = format("Use %s",pcVar12);
            }
            else {
              pcVar12 = format("Use %s: %s",pcVar12);
            }
            pcVar12 = string_make(pcVar12);
            entries[uVar10] = pcVar12;
            pcVar12 = string_make((psVar4->details).fnam);
            entries_00[uVar10] = pcVar12;
            _Var6 = suffix(savefile,(psVar4->details).fnam);
            if (_Var6) {
              if (uVar10 != 1) {
                pcVar12 = entries[uVar10];
                pcVar7 = entries_00[uVar10];
                uVar8 = uVar14;
                do {
                  entries[uVar8 + 1] = entries[uVar8 & 0xffffffff];
                  entries_00[uVar8 + 1] = entries_00[uVar8 & 0xffffffff];
                  lVar15 = uVar8 + 1;
                  uVar8 = uVar8 - 1;
                } while (2 < lVar15);
                entries[1] = pcVar12;
                entries_00[1] = pcVar7;
              }
              local_70 = 1;
              if (arg_force_name == false) {
                savefile[0] = '\0';
                arg_name[0] = '\0';
              }
            }
            uVar10 = uVar10 + 1;
            _Var6 = got_savefile(&local_68);
            uVar14 = uVar14 + 1;
          } while (_Var6);
          bVar2 = 0 < (int)uVar13;
          pcVar12 = local_40;
        }
        else {
          uVar10 = 1;
          bVar2 = true;
          local_70 = 0;
        }
        wVar9 = (wchar_t)uVar10;
        if ((local_68 == (savefile_getter)0x0) || (local_68->have_savedir != true)) {
          cleanup_savefile_getter(local_68);
          cleanup_savefile_selection_strings(entries_00,wVar9);
          cleanup_savefile_selection_strings(entries,wVar9);
          quit("Cannot open the savefile directory");
LAB_001cf19d:
          bVar16 = 0;
        }
        else {
          if ((!bVar2) || (*entries != (char *)0x0)) {
            __assert_fail("allocated > 0 && !entries[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                          ,0x330,"void select_savefile(_Bool, _Bool *)");
          }
          if ((local_70 == 0) || (arg_force_name != true)) {
            pcVar7 = string_make("New game");
            *entries = pcVar7;
            cleanup_savefile_getter(local_68);
            goto LAB_001cf19d;
          }
          if (*entries_00 != (char *)0x0) {
            __assert_fail("!entries[0] && !names[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                          ,0x338,"void select_savefile(_Bool, _Bool *)");
          }
          if (L'\x01' < wVar9) {
            uVar10 = 0;
            do {
              entries[uVar10] = entries[uVar10 + 1];
              entries_00[uVar10] = entries_00[uVar10 + 1];
              uVar10 = uVar10 + 1;
            } while ((uint)(wVar9 + L'\xffffffff') != uVar10);
          }
          cleanup_savefile_getter(local_68);
          bVar16 = 1;
          local_70 = 0;
          wVar9 = wVar9 + L'\xffffffff';
        }
        iter = menu_find_iter(MN_ITER_STRINGS);
        menu = menu_new(MN_SKIN_SCROLL,iter);
        menu_setpriv(menu,wVar9,entries);
        menu_layout(menu,&local_58);
        menu->cursor = local_70;
        *(byte *)&menu->flags = (byte)menu->flags | 0x10;
        screen_save();
        prt("Select the save to use (movement keys and enter or mouse) or quit",L'\0',L'\0');
        prt("(escape or second mouse button).",L'\x01',L'\0');
        prt(pcVar12,L'\x02',L'\0');
        uVar17 = menu_select(menu,0,false);
        screen_load();
        if (uVar17.type == EVT_SELECT) {
          wVar11 = menu->cursor;
          _Var5 = true;
          if (!(bool)(~bVar16 & (ulong)(uint)wVar11 == 0)) {
            if ((wVar11 < L'\x01') || (wVar9 <= wVar11)) {
              __assert_fail("m->cursor > 0 && m->cursor < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/ui-game.c"
                            ,0x362,"void select_savefile(_Bool, _Bool *)");
            }
            path_build(savefile,0x400,ANGBAND_DIR_SAVE,entries_00[(uint)wVar11]);
            _Var5 = false;
          }
        }
        menu_free(menu);
        cleanup_savefile_selection_strings(entries_00,wVar9);
        cleanup_savefile_selection_strings(entries,wVar9);
        if (uVar17.type == EVT_ESCAPE) {
          quit((char *)0x0);
        }
        _Var6 = start_game(_Var5);
        pcVar12 = "The previously selected savefile was unusable.";
      } while (!_Var6);
    }
    if (player->is_dead == false) {
      do {
        t = Term;
        p = player;
        if (player->upkeep->playing != true) break;
        if (character_dungeon == true) {
          puVar1 = &player->upkeep->redraw;
          *puVar1 = *puVar1 | 0xc18000;
          handle_stuff(p);
          if (((player->opts).opt[8] == true) && (_Var5 = target_sighted(), _Var5)) {
            target_get((loc_conflict *)&local_58);
            wVar9 = local_58.col;
            wVar11 = local_58.row;
          }
          else {
            wVar9 = (player->grid).x;
            wVar11 = (player->grid).y;
          }
          move_cursor_relative(wVar11,wVar9);
          lVar15 = 0;
          do {
            if (angband_term[lVar15] != (term *)0x0) {
              Term_activate(angband_term[lVar15]);
              Term_fresh();
            }
            lVar15 = lVar15 + 1;
          } while (lVar15 != 8);
        }
        Term_activate(t);
        (*cmd_get_hook)(CTX_GAME);
        run_game_loop();
      } while (player->is_dead != true);
    }
    close_game(true);
    if (play_again != true) {
      return;
    }
    cleanup_angband();
    init_display();
    init_angband();
    if (reinit_hook != (_func_void *)0x0) {
      (*reinit_hook)();
    }
    textui_init();
    local_5c = local_5c + (local_5c == GAME_LOAD);
  } while( true );
}

Assistant:

void play_game(enum game_mode_type mode)
{
	while (1) {
		play_again = false;

		/* Load a savefile or birth a character, or both */
		switch (mode) {
		case GAME_LOAD:
		case GAME_NEW:
			if (!start_game(mode == GAME_NEW)) {
				quit("Broken savefile");
			}
			break;

		case GAME_SELECT:
			{
				bool new_game = false, retry = false;

				while (1) {
					select_savefile(retry, &new_game);
					if (start_game(new_game)) {
						break;
					}
					retry = true;
				}
			}
			break;

		default:
			quit("Invalid game mode in play_game()");
			break;
		}

		/* Get commands from the user, then process the game world
		 * until the command queue is empty and a new player command
		 * is needed */
		while (!player->is_dead && player->upkeep->playing) {
			pre_turn_refresh();
			cmd_get_hook(CTX_GAME);
			run_game_loop();
		}

		/* Close game on death or quitting */
		close_game(true);

		if (!play_again) break;

		cleanup_angband();
		init_display();
		init_angband();
		if (reinit_hook != NULL) {
			(*reinit_hook)();
		}
		textui_init();
		if (mode == GAME_LOAD) {
			mode = GAME_NEW;
		}
	}
}